

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O1

void __thiscall just::file::impl::input_file::input_file(input_file *this,string *filename_)

{
  pointer pcVar1;
  FILE *pFVar2;
  long *plVar3;
  size_type *psVar4;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (this->_filename)._M_dataplus._M_p = (pointer)&(this->_filename).field_2;
  pcVar1 = (filename_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + filename_->_M_string_length);
  pFVar2 = fopen((filename_->_M_dataplus)._M_p,"rb");
  this->_f = (FILE *)pFVar2;
  if (pFVar2 == (FILE *)0x0) {
    std::operator+(&local_40,"Error opening ",filename_);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_60.field_2._M_allocated_capacity = *psVar4;
      local_60.field_2._8_8_ = plVar3[3];
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    }
    else {
      local_60.field_2._M_allocated_capacity = *psVar4;
      local_60._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_60._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    throw_errno(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

explicit input_file(const std::string& filename_) :
          _filename(filename_),
          _f(std::fopen(filename_.c_str(), "rb"))
        {
          if (!_f)
          {
            throw_errno("Error opening " + filename_ + " for reading");
          }
        }